

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O3

void __thiscall
LASreadItemCompressed_WAVEPACKET14_v3::LASreadItemCompressed_WAVEPACKET14_v3
          (LASreadItemCompressed_WAVEPACKET14_v3 *this,ArithmeticDecoder *dec,
          U32 decompress_selective)

{
  long lVar1;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015cb18;
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    lVar1 = 0;
    this->num_bytes_wavepacket = 0;
    this->instream_wavepacket = (ByteStreamInArray *)0x0;
    this->dec_wavepacket = (ArithmeticDecoder *)0x0;
    this->changed_wavepacket = false;
    this->requested_wavepacket = (BOOL)((byte)(decompress_selective >> 10) & 1);
    this->bytes = (U8 *)0x0;
    this->num_bytes_allocated = 0;
    do {
      *(undefined8 *)((long)this->contexts[0].m_offset_diff + lVar1 + -8) = 0;
      lVar1 = lVar1 + 0x70;
    } while (lVar1 != 0x1c0);
    this->current_context = 0;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v3.cpp"
                ,0x72b,
                "LASreadItemCompressed_WAVEPACKET14_v3::LASreadItemCompressed_WAVEPACKET14_v3(ArithmeticDecoder *, const U32)"
               );
}

Assistant:

LASreadItemCompressed_WAVEPACKET14_v3::LASreadItemCompressed_WAVEPACKET14_v3(ArithmeticDecoder* dec, const U32 decompress_selective)
{
  /* not used as a decoder. just gives access to instream */

  assert(dec);
  this->dec = dec;

  /* zero instreams and decoders */

  instream_wavepacket = 0;

  dec_wavepacket = 0;

  /* zero num_bytes and init booleans */

  num_bytes_wavepacket = 0;

  changed_wavepacket = FALSE;

  requested_wavepacket = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_WAVEPACKET ? TRUE : FALSE);

  /* init the bytes buffer to zero */

  bytes = 0;
  num_bytes_allocated = 0;

  /* mark the four scanner channel contexts as uninitialized */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].m_packet_index = 0;
  }
  current_context = 0;
}